

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitSum(EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,SumExpr expr)

{
  int iVar1;
  EExpr *ee1;
  long lVar2;
  BucketAccumulator<mp::EExpr> bucketaccum;
  QuadAndLinTerms local_6ff8;
  BucketAccumulator<mp::EExpr> local_6e38;
  
  if ((this->flat_cvt_).
      super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      .options_.useQP2Pass_ == 0) {
    BucketAccumulator<mp::EExpr>::BucketAccumulator
              (&local_6e38,
               (long)*(int *)((long)expr.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                    super_ExprBase.impl_ + 4));
    iVar1 = *(int *)((long)expr.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                           super_ExprBase.impl_ + 4);
    for (lVar2 = 0; (long)iVar1 * 8 != lVar2; lVar2 = lVar2 + 8) {
      BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
      ::Visit((EExpr *)&local_6ff8,
              (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
               *)this,(Expr)((ExprBase *)
                            ((long)expr.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                   super_ExprBase.impl_ + 8 + lVar2))->impl_);
      BucketAccumulator<mp::EExpr>::Add(&local_6e38,(EExpr *)&local_6ff8);
      QuadAndLinTerms::~QuadAndLinTerms(&local_6ff8);
    }
    BucketAccumulator<mp::EExpr>::ExtractSum(__return_storage_ptr__,&local_6e38);
    BucketAccumulator<mp::EExpr>::~BucketAccumulator(&local_6e38);
  }
  else {
    QP2Passes::QP2Passes
              ((QP2Passes *)&local_6e38,&this->super_BasicProblemFlattener,this->p_qp2p_visitor_);
    QP2Passes::Process((QP2Passes *)&local_6e38,
                       (Expr)expr.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                             super_ExprBase.impl_);
    QP2Passes::GetResult(__return_storage_ptr__,(QP2Passes *)&local_6e38);
    QP2Passes::~QP2Passes((QP2Passes *)&local_6e38);
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitSum(typename BaseExprVisitor::SumExpr expr) {
    if (GetFlatCvt().IfParseQPIn2Passes()) {
#ifdef DEBUG_QP2PASSES
      static int depth=0;
      ++depth;
      {
        fmt::MemoryWriter wrt;
        wrt << "FLATTEN: ";
        WriteExpr<typename ProblemType::ExprTypes>(
            wrt, LinearExpr{}, Cast<NumericExpr>(expr),
            GetModel().GetVarNamer());
        fmt::print("{:{}}{}\n", "", depth*2, wrt.str());
      }
#endif
      QP2Passes qp2p {*this, GetQP2PVisitor()};
      qp2p.Process(expr);
      // return qp2p.GetResult();
      auto ee1 = qp2p.GetResult();
#ifdef DEBUG_QP2PASSES
      {
        fmt::MemoryWriter wrt;
        BucketAccumulator<EExpr> bucketaccum(expr.num_args());
        for (auto i =
             expr.begin(), end = expr.end(); i != end; ++i)
          bucketaccum.Add( MP_DISPATCH( Convert2EExpr(*i) ) );
        auto ee2 = bucketaccum.ExtractSum();
        wrt << "FLAT DONE: ";
        WriteExpr<typename ProblemType::ExprTypes>(
            wrt, LinearExpr{}, Cast<NumericExpr>(expr),
            GetModel().GetVarNamer());
        fmt::print("{:{}}{}\n{:{}}RESULT: ",
                   "", depth*2,  wrt.str(), "", depth*2);
        wrt.clear();
        wrt << ee1.constant_term() << " + ";
        WriteModelItem(wrt, ee1.GetBody(), GetFlatCvt().GetVarNamer());
        fmt::print("{}\n", wrt.str());
        wrt.clear();
        wrt << ee2.constant_term() << " + ";
        WriteModelItem(wrt, ee2.GetBody(), GetFlatCvt().GetVarNamer());
        fmt::print("{:{}}RESULT_BUCKETS: {}\n",
                   "", depth*2,  wrt.str());
        MP_ASSERT_ALWAYS(ee1 == ee2, "AAAKKKAAAAK ... ");
      }
      --depth;
#endif
      return ee1;
    }  // else
    BucketAccumulator<EExpr> bucketaccum(expr.num_args());
    for (auto i =
         expr.begin(), end = expr.end(); i != end; ++i)
      bucketaccum.Add( MP_DISPATCH( Convert2EExpr(*i) ) );
    return bucketaccum.ExtractSum();
  }